

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O0

NBestEncodeResult * __thiscall
sentencepiece::unigram::Model::NBestEncode(Model *this,string_view normalized,int nbest_size)

{
  initializer_list<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>
  __l;
  initializer_list<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>
  __l_00;
  string_view sentence;
  bool bVar1;
  int *piVar2;
  char *in_RCX;
  size_t in_RDX;
  long *in_RSI;
  NBestEncodeResult *in_RDI;
  Node *node;
  const_iterator __end3;
  const_iterator __begin3;
  vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
  *__range3;
  EncodeResult results;
  pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>
  *nbest;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>,_std::allocator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_>_>
  *__range2;
  Lattice lattice;
  float in_stack_00000238;
  undefined1 in_stack_0000023f;
  size_t in_stack_00000240;
  Lattice *in_stack_00000248;
  NBestEncodeResult *nbest_results;
  vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
  *this_00;
  Lattice *in_stack_fffffffffffffce0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffce8;
  pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>
  *in_stack_fffffffffffffcf0;
  Lattice *in_stack_fffffffffffffd00;
  allocator_type *in_stack_fffffffffffffd08;
  undefined8 ***pppuVar3;
  vector<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
  *in_stack_fffffffffffffd10;
  undefined8 ***pppuVar4;
  iterator in_stack_fffffffffffffd18;
  size_type in_stack_fffffffffffffd20;
  undefined1 *puVar5;
  Lattice *in_stack_fffffffffffffd40;
  size_t in_stack_fffffffffffffd48;
  char *in_stack_fffffffffffffd50;
  undefined1 ***local_2a0;
  bool local_279;
  __normal_iterator<sentencepiece::unigram::Lattice::Node_*const_*,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
  local_240;
  reference local_238;
  reference local_218;
  pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>
  *local_210;
  __normal_iterator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_*,_std::vector<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>,_std::allocator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_>_>_>
  local_208 [4];
  Lattice *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
  local_1c0 [6];
  undefined1 local_122;
  undefined1 local_121;
  undefined8 local_120;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined1 local_100 [24];
  undefined8 **local_e8;
  undefined1 **local_e0 [4];
  undefined8 **local_c0;
  undefined8 local_b8;
  int local_ac [2];
  undefined1 local_a1;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 **local_78;
  undefined1 **local_70 [4];
  undefined8 **local_50;
  undefined8 local_48;
  int local_24 [3];
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_18._M_len = in_RDX;
  local_18._M_str = in_RCX;
  (**(code **)(*in_RSI + 0x10))();
  bVar1 = util::Status::ok((Status *)0x483648);
  local_279 = true;
  if (bVar1) {
    local_279 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  }
  util::Status::~Status((Status *)0x483697);
  if (local_279 == false) {
    local_ac[1] = 1;
    local_ac[0] = 0x400;
    piVar2 = std::min<int>(local_24,local_ac);
    piVar2 = std::max<int>(local_ac + 1,piVar2);
    local_24[0] = *piVar2;
    if (local_24[0] < 2) {
      local_121 = 1;
      local_e8 = local_e0;
      local_118 = (undefined4)local_18._M_len;
      uStack_114 = local_18._M_len._4_4_;
      uStack_110 = local_18._M_str._0_4_;
      uStack_10c = local_18._M_str._4_4_;
      (**(code **)(*in_RSI + 0x28))(local_100,in_RSI,local_18._M_len,local_18._M_str);
      local_120 = 0;
      std::
      pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>
      ::
      pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_double,_true>
                (in_stack_fffffffffffffcf0,
                 (vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                  *)in_stack_fffffffffffffce8,(double *)in_stack_fffffffffffffce0);
      local_121 = 0;
      local_c0 = local_e0;
      local_b8 = 1;
      puVar5 = &local_122;
      std::
      allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>
      ::allocator((allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>
                   *)0x4839ef);
      __l_00._M_len = (size_type)puVar5;
      __l_00._M_array = in_stack_fffffffffffffd18;
      std::
      vector<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
      ::vector(in_stack_fffffffffffffd10,__l_00,in_stack_fffffffffffffd08);
      std::
      allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>
      ::~allocator((allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>
                    *)0x483a20);
      pppuVar4 = (undefined8 ***)local_e0;
      pppuVar3 = &local_c0;
      do {
        pppuVar3 = pppuVar3 + -4;
        std::
        pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>
        ::~pair((pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>
                 *)0x483a49);
      } while (pppuVar3 != pppuVar4);
      std::
      vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
      ::~vector(&in_stack_fffffffffffffcf0->first);
    }
    else {
      this_00 = local_1c0;
      Lattice::Lattice(in_stack_fffffffffffffd00);
      sentence._M_str = in_stack_fffffffffffffd50;
      sentence._M_len = in_stack_fffffffffffffd48;
      Lattice::SetSentence(in_stack_fffffffffffffd40,sentence);
      PopulateNodes((Model *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                    in_stack_fffffffffffffe18);
      std::
      vector<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
      ::vector((vector<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
                *)0x483bca);
      Lattice::NBest(in_stack_00000248,in_stack_00000240,(bool)in_stack_0000023f,in_stack_00000238);
      local_208[0]._M_current =
           (pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>
            *)std::
              vector<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>,_std::allocator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_>_>
              ::begin((vector<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>,_std::allocator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_>_>
                       *)this_00);
      local_210 = (pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>
                   *)std::
                     vector<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>,_std::allocator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_>_>
                     ::end((vector<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>,_std::allocator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_>_>
                            *)this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_*,_std::vector<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>,_std::allocator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_>_>_>
                                 *)in_stack_fffffffffffffce0,
                                (__normal_iterator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_*,_std::vector<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>,_std::allocator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_>_>_>
                                 *)this_00), bVar1) {
        local_218 = __gnu_cxx::
                    __normal_iterator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_*,_std::vector<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>,_std::allocator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_>_>_>
                    ::operator*(local_208);
        std::
        vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
        ::vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                  *)0x483ca7);
        local_238 = local_218;
        local_240._M_current =
             (Node **)std::
                      vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                      ::begin(this_00);
        std::
        vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
        ::end(this_00);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<sentencepiece::unigram::Lattice::Node_*const_*,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
                                   *)in_stack_fffffffffffffce0,
                                  (__normal_iterator<sentencepiece::unigram::Lattice::Node_*const_*,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
                                   *)this_00), bVar1) {
          __gnu_cxx::
          __normal_iterator<sentencepiece::unigram::Lattice::Node_*const_*,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
          ::operator*(&local_240);
          std::
          vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>
          ::emplace_back<std::basic_string_view<char,std::char_traits<char>>const&,int_const&>
                    (&in_stack_fffffffffffffcf0->first,in_stack_fffffffffffffce8,
                     (int *)in_stack_fffffffffffffce0);
          __gnu_cxx::
          __normal_iterator<sentencepiece::unigram::Lattice::Node_*const_*,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
          ::operator++(&local_240);
        }
        std::
        vector<std::pair<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>,float>,std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>,float>>>
        ::
        emplace_back<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>&,float_const&>
                  ((vector<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
                    *)in_stack_fffffffffffffcf0,
                   (vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                    *)in_stack_fffffffffffffce8,(float *)in_stack_fffffffffffffce0);
        std::
        vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
        ::~vector(&in_stack_fffffffffffffcf0->first);
        __gnu_cxx::
        __normal_iterator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_*,_std::vector<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>,_std::allocator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_>_>_>
        ::operator++(local_208);
      }
      std::
      vector<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>,_std::allocator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_>_>
      ::~vector((vector<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>,_std::allocator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_>_>
                 *)in_stack_fffffffffffffcf0);
      Lattice::~Lattice(in_stack_fffffffffffffce0);
    }
  }
  else {
    local_a1 = 1;
    local_78 = local_70;
    local_98 = 0;
    uStack_90 = 0;
    local_88 = 0;
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
    ::vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
              *)0x4836f3);
    local_a0 = 0;
    std::
    pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>
    ::pair<double,_true>
              (in_stack_fffffffffffffcf0,
               (vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                *)in_stack_fffffffffffffce8,(double *)in_stack_fffffffffffffce0);
    local_a1 = 0;
    local_50 = local_70;
    local_48 = 1;
    std::
    allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>
    ::allocator((allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>
                 *)0x483757);
    __l._M_len = in_stack_fffffffffffffd20;
    __l._M_array = in_stack_fffffffffffffd18;
    std::
    vector<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
    ::vector(in_stack_fffffffffffffd10,__l,in_stack_fffffffffffffd08);
    std::
    allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>
    ::~allocator((allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>
                  *)0x48378b);
    local_2a0 = (undefined1 ***)&local_50;
    do {
      local_2a0 = local_2a0 + -4;
      std::
      pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>
      ::~pair((pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>
               *)0x4837bd);
    } while (local_2a0 != local_70);
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
    ::~vector(&in_stack_fffffffffffffcf0->first);
  }
  return in_RDI;
}

Assistant:

NBestEncodeResult Model::NBestEncode(absl::string_view normalized,
                                     int nbest_size) const {
  if (!status().ok() || normalized.empty()) {
    return {{{}, 0.0}};
  }

  nbest_size = std::max<int>(1, std::min<int>(nbest_size, 1024));

  if (nbest_size <= 1) {
    return {std::pair<EncodeResult, float>(Encode(normalized), 0.0)};
  }

  Lattice lattice;
  lattice.SetSentence(normalized);
  PopulateNodes(&lattice);

  NBestEncodeResult nbest_results;
  for (const auto &nbest : lattice.NBest(nbest_size, false, 0.0)) {
    EncodeResult results;
    for (const auto *node : nbest.first) {
      results.emplace_back(node->piece, node->id);
    }
    nbest_results.emplace_back(results, nbest.second);
  }

  return nbest_results;
}